

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::DoIncludeFile
          (FileGenerator *this,string *google3_name,bool do_export,Printer *printer)

{
  long lVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  string path;
  LogMessage local_d0;
  allocator local_81;
  string local_80 [8];
  string prefix;
  Formatter format;
  Printer *printer_local;
  bool do_export_local;
  string *google3_name_local;
  FileGenerator *this_local;
  
  Formatter::Formatter((Formatter *)((long)&prefix.field_2 + 8),printer,&this->variables_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"net/proto2/",&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  lVar1 = std::__cxx11::string::find((string *)google3_name,(ulong)local_80);
  path.field_2._M_local_buf[0xf] = '\0';
  if (lVar1 != 0) {
    internal::LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
               ,0x143);
    path.field_2._M_local_buf[0xf] = '\x01';
    pLVar2 = internal::LogMessage::operator<<
                       (&local_d0,"CHECK failed: google3_name.find(prefix) == 0: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,google3_name);
    internal::LogFinisher::operator=((LogFinisher *)(path.field_2._M_local_buf + 0xe),pLVar2);
  }
  if ((path.field_2._M_local_buf[0xf] & 1U) != 0) {
    internal::LogMessage::~LogMessage(&local_d0);
  }
  if (((this->options_).opensource_runtime & 1U) == 0) {
    Formatter::operator()((Formatter *)((long)&prefix.field_2 + 8),"#include \"$1$\"",google3_name);
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_f8,(ulong)google3_name);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"internal/",&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"",&local_161);
    StringReplace(&local_118,(string *)local_f8,&local_138,&local_160,false);
    std::__cxx11::string::operator=((string *)local_f8,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,"proto/",&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,"",&local_1d1);
    StringReplace(&local_188,(string *)local_f8,&local_1a8,&local_1d0,false);
    std::__cxx11::string::operator=((string *)local_f8,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,"public/",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_240,"",&local_241);
    StringReplace(&local_1f8,(string *)local_f8,&local_218,&local_240,false);
    std::__cxx11::string::operator=((string *)local_f8,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      Formatter::operator()
                ((Formatter *)((long)&prefix.field_2 + 8),"#include \"$1$google/protobuf/$2$\"",
                 &(this->options_).runtime_include_base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    }
    else {
      Formatter::operator()
                ((Formatter *)((long)&prefix.field_2 + 8),"#include <google/protobuf/$1$>",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    }
    std::__cxx11::string::~string((string *)local_f8);
  }
  if (do_export) {
    Formatter::operator()<>((Formatter *)((long)&prefix.field_2 + 8),"  // IWYU pragma: export");
  }
  Formatter::operator()<>((Formatter *)((long)&prefix.field_2 + 8),"\n");
  std::__cxx11::string::~string(local_80);
  Formatter::~Formatter((Formatter *)((long)&prefix.field_2 + 8));
  return;
}

Assistant:

void FileGenerator::DoIncludeFile(const std::string& google3_name,
                                  bool do_export, io::Printer* printer) {
  Formatter format(printer, variables_);
  const std::string prefix = "net/proto2/";
  GOOGLE_CHECK(google3_name.find(prefix) == 0) << google3_name;

  if (options_.opensource_runtime) {
    std::string path = google3_name.substr(prefix.size());

    path = StringReplace(path, "internal/", "", false);
    path = StringReplace(path, "proto/", "", false);
    path = StringReplace(path, "public/", "", false);
    if (options_.runtime_include_base.empty()) {
      format("#include <google/protobuf/$1$>", path);
    } else {
      format("#include \"$1$google/protobuf/$2$\"",
             options_.runtime_include_base, path);
    }
  } else {
    format("#include \"$1$\"", google3_name);
  }

  if (do_export) {
    format("  // IWYU pragma: export");
  }

  format("\n");
}